

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::inputMethodEvent(QWidgetTextControlPrivate *this,QInputMethodEvent *e)

{
  QTextCursor *this_00;
  QObject *pQVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QList_conflict *pQVar9;
  QMetaType QVar10;
  FormatRange *pFVar11;
  ulong uVar12;
  iterator iVar13;
  iterator iVar14;
  QTextFormat *pQVar15;
  long lVar16;
  MoveMode MVar17;
  int *piVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  QStringView QVar22;
  QStringView QVar23;
  QTextCursor oldCursor;
  QTextCursor c;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined1 local_98 [8];
  undefined1 auStack_90 [24];
  undefined1 *local_78;
  undefined1 *puStack_70;
  QArrayData *local_68;
  undefined8 local_60;
  QArrayDataPointer<QTextLayout::FormatRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x11) != 0) {
    pQVar1 = *(QObject **)&this->field_0x8;
    this_00 = &this->cursor;
    cVar3 = QTextCursor::isNull();
    if (cVar3 == '\0') {
      if (*(long *)(e + 0x38) == 0) {
        QTextCursor::block();
        QTextBlock::layout();
        QTextLayout::preeditAreaText();
        lVar20 = *(long *)(e + 0x20);
        bVar4 = true;
        if ((lVar20 == local_58.size) &&
           (QVar22.m_data = *(storage_type_conflict **)(e + 0x18), QVar22.m_size = lVar20,
           QVar23.m_data = (storage_type_conflict *)local_58.ptr, QVar23.m_size = lVar20,
           cVar3 = QtPrivate::equalStrings(QVar22,QVar23), cVar3 != '\0')) {
          bVar4 = 0 < *(int *)(e + 0x5c);
        }
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
          }
        }
        bVar2 = true;
        if (!bVar4) {
          if (*(long *)(e + 0x50) == 0) goto LAB_004c24f9;
          bVar2 = false;
        }
      }
      else {
        bVar2 = true;
      }
      iVar5 = QTextCursor::position();
      QTextCursor::beginEditBlock();
      if (bVar2) {
        QTextCursor::removeSelectedText();
      }
      local_68 = (QArrayData *)0x0;
      local_60 = 0xaaaaaaaa00000000;
      if ((*(long *)(e + 0x38) != 0) || (*(int *)(e + 0x5c) != 0)) {
        cVar3 = QString::endsWith((QChar)((short)e + L'('),10);
        if (cVar3 != '\0') {
          QTextCursor::block();
          local_68 = &(local_58.d)->super_QArrayData;
          local_60 = CONCAT44(local_60._4_4_,local_58.ptr._0_4_);
        }
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::QTextCursor((QTextCursor *)&local_58,this_00);
        iVar6 = QTextCursor::position();
        iVar7 = (int)&local_58;
        QTextCursor::setPosition(iVar7,iVar6 + *(int *)(e + 0x58));
        iVar6 = QTextCursor::position();
        QTextCursor::setPosition(iVar7,iVar6 + *(int *)(e + 0x5c));
        QTextCursor::insertText((QString *)&local_58);
        QTextCursor::~QTextCursor((QTextCursor *)&local_58);
      }
      uVar12 = *(ulong *)(e + 0x50);
      if (uVar12 != 0) {
        lVar20 = 8;
        uVar21 = 0;
        do {
          lVar16 = *(long *)(e + 0x48);
          if (*(int *)(lVar16 + -8 + lVar20) == 4) {
            local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            QTextCursor::QTextCursor((QTextCursor *)local_98,this_00);
            iVar6 = *(int *)(lVar16 + -4 + lVar20);
            QTextCursor::block();
            iVar7 = QTextBlock::position();
            MVar17 = iVar6 + iVar7;
            QTextCursor::setPosition((int)this_00,MVar17);
            QTextCursor::setPosition((int)this_00,MVar17 + *(int *)(lVar16 + lVar20));
            (**(code **)(*(long *)pQVar1 + 0x60))();
            repaintOldAndNewSelection(this,(QTextCursor *)local_98);
            QTextCursor::~QTextCursor((QTextCursor *)local_98);
            uVar12 = *(ulong *)(e + 0x50);
          }
          uVar21 = uVar21 + 1;
          lVar20 = lVar20 + 0x30;
        } while (uVar21 < uVar12);
      }
      cVar3 = QTextBlock::isValid();
      if (cVar3 == '\0') {
        QTextCursor::block();
        local_68 = &(local_58.d)->super_QArrayData;
        local_60 = CONCAT44(local_60._4_4_,local_58.ptr._0_4_);
      }
      pQVar9 = (QList_conflict *)QTextBlock::layout();
      if (bVar2) {
        iVar6 = QTextCursor::position();
        iVar7 = QTextBlock::position();
        QTextLayout::setPreeditArea((int)pQVar9,(QString *)(ulong)(uint)(iVar6 - iVar7));
      }
      local_58.d = (Data *)0x0;
      local_58.ptr = (FormatRange *)0x0;
      local_58.size = 0;
      QList<QTextLayout::FormatRange>::reserve
                ((QList<QTextLayout::FormatRange> *)&local_58,*(qsizetype *)(e + 0x50));
      iVar6 = this->preeditCursor;
      this->preeditCursor = *(int *)(e + 0x20);
      this->hideCursor = false;
      uVar12 = *(ulong *)(e + 0x50);
      if (uVar12 != 0) {
        uVar21 = 0;
        do {
          lVar20 = *(long *)(e + 0x48) + uVar21 * 0x30;
          iVar7 = *(int *)(*(long *)(e + 0x48) + uVar21 * 0x30);
          if (iVar7 == 0) {
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextCursor::charFormat();
            pQVar15 = (QTextFormat *)(lVar20 + 0x10);
            local_98 = (undefined1  [8])&QtPrivate::QMetaTypeInterfaceWrapper<QTextFormat>::metaType
            ;
            local_78 = (undefined1 *)(*(ulong *)(lVar20 + 0x28) & 0xfffffffffffffffc);
            bVar4 = comparesEqual((QMetaType *)&local_78,(QMetaType *)local_98);
            if (bVar4) {
              if ((*(byte *)(lVar20 + 0x28) & 1) != 0) {
                pQVar15 = (QTextFormat *)((long)*(int *)(*(long *)pQVar15 + 4) + *(long *)pQVar15);
              }
              QTextFormat::QTextFormat((QTextFormat *)&local_78,pQVar15);
            }
            else {
              local_78 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
              QTextFormat::QTextFormat((QTextFormat *)&local_78);
              QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
              if ((*(byte *)(lVar20 + 0x28) & 1) != 0) {
                pQVar15 = (QTextFormat *)((long)*(int *)(*(long *)pQVar15 + 4) + *(long *)pQVar15);
              }
              QMetaType::convert(QVar10,pQVar15,(QMetaType)local_98,(QTextFormat *)&local_78);
            }
            QTextFormat::toCharFormat();
            QTextFormat::merge((QTextFormat *)local_b8);
            QTextFormat::~QTextFormat((QTextFormat *)local_98);
            QTextFormat::~QTextFormat((QTextFormat *)&local_78);
            iVar7 = QTextFormat::type();
            if (iVar7 == 2) {
              auStack_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
              auStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QTextCharFormat::QTextCharFormat((QTextCharFormat *)auStack_90);
              iVar7 = *(int *)(lVar20 + 4);
              iVar8 = QTextCursor::position();
              iVar19 = QTextBlock::position();
              local_98._4_4_ = *(undefined4 *)(lVar20 + 8);
              local_98._0_4_ = (iVar8 + iVar7) - iVar19;
              QTextFormat::operator=((QTextFormat *)auStack_90,(QTextFormat *)local_b8);
              iVar13 = QList<QTextLayout::FormatRange>::end
                                 ((QList<QTextLayout::FormatRange> *)&local_58);
              lVar20 = -0x18 - (long)iVar13.i;
              do {
                lVar16 = lVar20;
                pFVar11 = iVar13.i;
                iVar13 = QList<QTextLayout::FormatRange>::begin
                                   ((QList<QTextLayout::FormatRange> *)&local_58);
                if (pFVar11 == iVar13.i) goto LAB_004c2a80;
                iVar13.i = pFVar11 + -1;
                lVar20 = lVar16 + 0x18;
              } while ((int)local_98._0_4_ < pFVar11[-1].start);
              QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::insert
                        ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_58,
                         (-((long)&local_58.ptr[1].start + lVar16) >> 3) * -0x5555555555555555,1,
                         (parameter_type)local_98);
              QList<QTextLayout::FormatRange>::begin((QList<QTextLayout::FormatRange> *)&local_58);
LAB_004c2a80:
              iVar13 = QList<QTextLayout::FormatRange>::begin
                                 ((QList<QTextLayout::FormatRange> *)&local_58);
              if (pFVar11 == iVar13.i) {
                QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                emplace<QTextLayout::FormatRange_const&>
                          ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_58,0,
                           (FormatRange *)local_98);
              }
              QTextFormat::~QTextFormat((QTextFormat *)auStack_90);
            }
            QTextFormat::~QTextFormat((QTextFormat *)local_b8);
            uVar12 = *(ulong *)(e + 0x50);
          }
          else if (iVar7 == 1) {
            this->preeditCursor = *(int *)(lVar20 + 4);
            this->hideCursor = *(int *)(lVar20 + 8) == 0;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar12);
      }
      QTextCursor::charFormat();
      iVar7 = QTextFormat::type();
      QTextFormat::~QTextFormat((QTextFormat *)local_98);
      if (iVar7 == 2) {
        iVar7 = QTextCursor::position();
        iVar8 = QTextBlock::position();
        iVar7 = iVar7 - iVar8;
        iVar8 = *(int *)(e + 0x20) + iVar7;
        iVar13 = QList<QTextLayout::FormatRange>::begin
                           ((QList<QTextLayout::FormatRange> *)&local_58);
        iVar14 = QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_58);
        if (iVar13.i != iVar14.i) {
          do {
            auStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            auStack_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_98 = *(undefined1 (*) [8])iVar13.i;
            QTextFormat::QTextFormat
                      ((QTextFormat *)auStack_90,&((iVar13.i)->format).super_QTextFormat);
            iVar19 = local_98._0_4_ - iVar7;
            if (iVar19 != 0 && iVar7 <= (int)local_98._0_4_) {
              local_a8 = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              pQVar15 = (QTextFormat *)(local_b8 + 8);
              QTextCharFormat::QTextCharFormat((QTextCharFormat *)pQVar15);
              local_b8._4_4_ = iVar19;
              local_b8._0_4_ = iVar7;
              QTextCursor::charFormat();
              QTextFormat::operator=(pQVar15,(QTextFormat *)&local_78);
              QTextFormat::~QTextFormat((QTextFormat *)&local_78);
              lVar20 = (long)iVar13.i - (long)local_58.ptr;
              QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::insert
                        ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_58,
                         (lVar20 >> 3) * -0x5555555555555555,1,(parameter_type)local_b8);
              iVar13 = QList<QTextLayout::FormatRange>::begin
                                 ((QList<QTextLayout::FormatRange> *)&local_58);
              iVar13.i = iVar13.i + lVar20 + 0x18;
              QTextFormat::~QTextFormat(pQVar15);
            }
            iVar13.i = iVar13.i + 1;
            iVar7 = local_98._0_4_ + local_98._4_4_;
            QTextFormat::~QTextFormat((QTextFormat *)auStack_90);
            iVar14 = QList<QTextLayout::FormatRange>::end
                               ((QList<QTextLayout::FormatRange> *)&local_58);
          } while (iVar13.i != iVar14.i);
        }
        iVar19 = iVar8 - iVar7;
        if (iVar19 != 0 && iVar7 <= iVar8) {
          auStack_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          auStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)auStack_90);
          local_98._4_4_ = iVar19;
          local_98._0_4_ = iVar7;
          QTextCursor::charFormat();
          QTextFormat::operator=((QTextFormat *)auStack_90,(QTextFormat *)local_b8);
          QTextFormat::~QTextFormat((QTextFormat *)local_b8);
          QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
          emplace<QTextLayout::FormatRange_const&>
                    ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_58,local_58.size,
                     (FormatRange *)local_98);
          QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_58);
          QTextFormat::~QTextFormat((QTextFormat *)auStack_90);
        }
      }
      QTextLayout::setFormats(pQVar9);
      QTextCursor::endEditBlock();
      piVar18 = *(int **)this_00;
      if (piVar18 != (int *)0x0) {
        if (*piVar18 != 1) {
          QSharedDataPointer<QTextCursorPrivate>::detach_helper
                    ((QSharedDataPointer<QTextCursorPrivate> *)this_00);
          piVar18 = *(int **)this_00;
          if (piVar18 == (int *)0x0) goto LAB_004c2d38;
        }
        if (*piVar18 != 1) {
          QSharedDataPointer<QTextCursorPrivate>::detach_helper
                    ((QSharedDataPointer<QTextCursorPrivate> *)this_00);
        }
        QTextCursorPrivate::setX();
      }
LAB_004c2d38:
      iVar7 = QTextCursor::position();
      if (iVar5 != iVar7) {
        QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,6,(void **)0x0);
      }
      if (iVar6 != this->preeditCursor) {
        QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,0xc,(void **)0x0);
      }
      QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_58);
      goto LAB_004c2d8f;
    }
  }
LAB_004c24f9:
  e[0xc] = (QInputMethodEvent)0x0;
LAB_004c2d8f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::inputMethodEvent(QInputMethodEvent *e)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & (Qt::TextEditable | Qt::TextSelectableByMouse)) || cursor.isNull()) {
        e->ignore();
        return;
    }
    bool isGettingInput = !e->commitString().isEmpty()
            || e->preeditString() != cursor.block().layout()->preeditAreaText()
            || e->replacementLength() > 0;

    if (!isGettingInput && e->attributes().isEmpty()) {
        e->ignore();
        return;
    }

    int oldCursorPos = cursor.position();

    cursor.beginEditBlock();
    if (isGettingInput) {
        cursor.removeSelectedText();
    }

    QTextBlock block;

    // insert commit string
    if (!e->commitString().isEmpty() || e->replacementLength()) {
        if (e->commitString().endsWith(QChar::LineFeed))
            block = cursor.block(); // Remember the block where the preedit text is
        QTextCursor c = cursor;
        c.setPosition(c.position() + e->replacementStart());
        c.setPosition(c.position() + e->replacementLength(), QTextCursor::KeepAnchor);
        c.insertText(e->commitString());
    }

    for (int i = 0; i < e->attributes().size(); ++i) {
        const QInputMethodEvent::Attribute &a = e->attributes().at(i);
        if (a.type == QInputMethodEvent::Selection) {
            QTextCursor oldCursor = cursor;
            int blockStart = a.start + cursor.block().position();
            cursor.setPosition(blockStart, QTextCursor::MoveAnchor);
            cursor.setPosition(blockStart + a.length, QTextCursor::KeepAnchor);
            q->ensureCursorVisible();
            repaintOldAndNewSelection(oldCursor);
        }
    }

    if (!block.isValid())
        block = cursor.block();
    QTextLayout *layout = block.layout();
    if (isGettingInput)
        layout->setPreeditArea(cursor.position() - block.position(), e->preeditString());
    QList<QTextLayout::FormatRange> overrides;
    overrides.reserve(e->attributes().size());
    const int oldPreeditCursor = preeditCursor;
    preeditCursor = e->preeditString().size();
    hideCursor = false;
    for (int i = 0; i < e->attributes().size(); ++i) {
        const QInputMethodEvent::Attribute &a = e->attributes().at(i);
        if (a.type == QInputMethodEvent::Cursor) {
            preeditCursor = a.start;
            hideCursor = !a.length;
        } else if (a.type == QInputMethodEvent::TextFormat) {
            QTextCharFormat f = cursor.charFormat();
            f.merge(qvariant_cast<QTextFormat>(a.value).toCharFormat());
            if (f.isValid()) {
                QTextLayout::FormatRange o;
                o.start = a.start + cursor.position() - block.position();
                o.length = a.length;
                o.format = f;

                // Make sure list is sorted by start index
                QList<QTextLayout::FormatRange>::iterator it = overrides.end();
                while (it != overrides.begin()) {
                    QList<QTextLayout::FormatRange>::iterator previous = it - 1;
                    if (o.start >= previous->start) {
                        overrides.insert(it, o);
                        break;
                    }
                    it = previous;
                }

                if (it == overrides.begin())
                    overrides.prepend(o);
            }
        }
    }

    if (cursor.charFormat().isValid()) {
        int start = cursor.position() - block.position();
        int end = start + e->preeditString().size();

        QList<QTextLayout::FormatRange>::iterator it = overrides.begin();
        while (it != overrides.end()) {
            QTextLayout::FormatRange range = *it;
            int rangeStart = range.start;
            if (rangeStart > start) {
                QTextLayout::FormatRange o;
                o.start = start;
                o.length = rangeStart - start;
                o.format = cursor.charFormat();
                it = overrides.insert(it, o) + 1;
            }

            ++it;
            start = range.start + range.length;
        }

        if (start < end) {
            QTextLayout::FormatRange o;
            o.start = start;
            o.length = end - start;
            o.format = cursor.charFormat();
            overrides.append(o);
        }
    }
    layout->setFormats(overrides);

    cursor.endEditBlock();

    if (cursor.d)
        cursor.d->setX();
    if (oldCursorPos != cursor.position())
        emit q->cursorPositionChanged();
    if (oldPreeditCursor != preeditCursor)
        emit q->microFocusChanged();
}